

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_add(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  int iVar1;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  REF_INT local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_30;
  REF_INT max_limit;
  REF_INT i;
  REF_INT chunk;
  REF_INT orig;
  REF_INT item;
  REF_INT reference_local;
  REF_INT node_local;
  REF_ADJ ref_adj_local;
  
  if (node < 0) {
    return 3;
  }
  if (ref_adj->nnode <= node) {
    local_30 = ref_adj->nnode;
    if (node - local_30 < 0) {
      local_38 = 0;
    }
    else {
      local_38 = node - local_30;
    }
    local_3c = local_38 + 100;
    if (local_3c <= (int)((double)local_30 * 0.5)) {
      local_3c = (int)((double)local_30 * 0.5);
    }
    if (local_3c < 0x7fffffff - local_30) {
      local_40 = local_3c;
    }
    else {
      local_40 = 0x7fffffff - local_30;
    }
    ref_adj->nnode = local_30 + local_40;
    fflush(_stdout);
    if (0 < ref_adj->nnode) {
      pRVar2 = (REF_INT *)realloc(ref_adj->first,(long)ref_adj->nnode << 2);
      ref_adj->first = pRVar2;
    }
    if (ref_adj->first == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x7a,
             "ref_adj_add","realloc ref_adj->first NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_adj->nnode,
             (long)ref_adj->nnode,4,(long)ref_adj->nnode << 2);
      return 2;
    }
    for (; local_30 < ref_adj->nnode; local_30 = local_30 + 1) {
      ref_adj->first[local_30] = -1;
    }
  }
  if (ref_adj->blank == -1) {
    if (ref_adj->nitem == 0x7fffffff) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x81,
             "ref_adj_add","the number of ref_adj items is too large for int, cannot grow");
      return 1;
    }
    iVar1 = ref_adj->nitem;
    if ((int)((double)iVar1 * 0.5) < 100) {
      local_44 = 100;
    }
    else {
      local_44 = (int)((double)iVar1 * 0.5);
    }
    if (local_44 < 0x7fffffff - iVar1) {
      local_48 = local_44;
    }
    else {
      local_48 = 0x7fffffff - iVar1;
    }
    ref_adj->nitem = iVar1 + local_48;
    fflush(_stdout);
    if (0 < ref_adj->nitem) {
      pRVar3 = (REF_ADJ_ITEM)realloc(ref_adj->item,(long)ref_adj->nitem << 3);
      ref_adj->item = pRVar3;
    }
    local_30 = iVar1;
    if (ref_adj->item == (REF_ADJ_ITEM)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c",0x88,
             "ref_adj_add","realloc ref_adj->item NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_adj->nitem,
             (long)ref_adj->nitem,8,(long)ref_adj->nitem << 3);
      return 2;
    }
    for (; local_30 < ref_adj->nitem; local_30 = local_30 + 1) {
      ref_adj->item[local_30].ref = -1;
      ref_adj->item[local_30].next = local_30 + 1;
    }
    ref_adj->item[ref_adj->nitem + -1].next = -1;
    ref_adj->blank = iVar1;
  }
  iVar1 = ref_adj->blank;
  ref_adj->blank = ref_adj->item[iVar1].next;
  ref_adj->item[iVar1].ref = reference;
  if ((node < 0) || (ref_adj->nnode <= node)) {
    local_4c = -1;
  }
  else {
    local_4c = ref_adj->first[node];
  }
  ref_adj->item[iVar1].next = local_4c;
  ref_adj->first[node] = iVar1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add(REF_ADJ ref_adj, REF_INT node,
                               REF_INT reference) {
  REF_INT item;
  REF_INT orig, chunk, i;
  REF_INT max_limit = REF_INT_MAX;

  if (node < 0) return REF_INVALID;

  if (node >= ref_adj_nnode(ref_adj)) {
    orig = ref_adj_nnode(ref_adj);
    chunk = 100 + MAX(0, node - orig);
    chunk = MAX(chunk, (REF_INT)(0.5 * (REF_DBL)orig));
    /* try to keep under 32-bit limit */
    chunk = MIN(chunk, max_limit - orig);
    ref_adj_nnode(ref_adj) = orig + chunk;
    ref_realloc(ref_adj->first, ref_adj_nnode(ref_adj), REF_INT);
    for (i = orig; i < ref_adj_nnode(ref_adj); i++)
      ref_adj->first[i] = REF_EMPTY;
  }

  if (REF_EMPTY == ref_adj_blank(ref_adj)) {
    RAS(ref_adj_nitem(ref_adj) != max_limit,
        "the number of ref_adj items is too large for int, cannot grow");

    orig = ref_adj_nitem(ref_adj);
    chunk = MAX(100, (REF_INT)(0.5 * (REF_DBL)orig));
    /* try to keep under 32-bit limit */
    chunk = MIN(chunk, max_limit - orig);
    ref_adj_nitem(ref_adj) = orig + chunk;
    ref_realloc(ref_adj->item, ref_adj_nitem(ref_adj), REF_ADJ_ITEM_STRUCT);
    for (i = orig; i < ref_adj_nitem(ref_adj); i++) {
      ref_adj->item[i].ref = REF_EMPTY;
      ref_adj->item[i].next = i + 1;
    }
    ref_adj->item[ref_adj_nitem(ref_adj) - 1].next = REF_EMPTY;
    ref_adj->blank = orig;
  }

  item = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = ref_adj_item_next(ref_adj, item);

  ref_adj_item_ref(ref_adj, item) = reference;
  ref_adj_item_next(ref_adj, item) = ref_adj_first(ref_adj, node);

  ref_adj->first[node] = item;

  return REF_SUCCESS;
}